

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall
MipsParser::parseRspVectorElement(MipsParser *this,Parser *parser,MipsRegisterValue *dest)

{
  TokenType TVar1;
  char *__rhs;
  long lVar2;
  bool bVar3;
  int iVar4;
  Token *pTVar5;
  long lVar6;
  MipsParser *this_00;
  size_type sVar7;
  allocator<char> local_91;
  string stringValue;
  string local_70;
  Identifier local_50;
  
  dest->type = RspVectorElement;
  pTVar5 = Parser::peekToken(parser,0);
  if (pTVar5->type == LBrack) {
    this_00 = (MipsParser *)parser;
    Parser::eatToken(parser);
    bVar3 = parseRegisterNumber(this_00,parser,dest,0x10);
    pTVar5 = Parser::nextToken(parser);
    TVar1 = pTVar5->type;
    if (bVar3) {
      bVar3 = TVar1 == RBrack;
    }
    else if ((TVar1 == NumberString) || (TVar1 == Integer)) {
      std::__cxx11::string::string((string *)&stringValue,(string *)&pTVar5->originalText);
      bVar3 = std::
              any_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(unsigned_int)noexcept>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )stringValue._M_dataplus._M_p,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(stringValue._M_dataplus._M_p + stringValue._M_string_length),iswupper);
      if (bVar3) {
        for (sVar7 = 0; stringValue._M_string_length != sVar7; sVar7 = sVar7 + 1) {
          iVar4 = tolower((int)stringValue._M_dataplus._M_p[sVar7]);
          stringValue._M_dataplus._M_p[sVar7] = (char)iVar4;
        }
      }
      lVar2 = 0;
      do {
        lVar6 = lVar2;
        if (lVar6 + 0x10 == 0x170) {
          bVar3 = false;
          goto LAB_001591f4;
        }
        __rhs = *(char **)((long)&parseRspVectorElement::rspElementNames[0].name + lVar6);
        bVar3 = std::operator==(&stringValue,__rhs);
        lVar2 = lVar6 + 0x10;
      } while (!bVar3);
      dest->num = *(int *)((long)&parseRspVectorElement::rspElementNames[0].num + lVar6);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__rhs,&local_91);
      Identifier::Identifier(&local_50,&local_70);
      std::__cxx11::string::operator=((string *)&dest->name,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      pTVar5 = Parser::nextToken(parser);
      bVar3 = pTVar5->type == RBrack;
LAB_001591f4:
      std::__cxx11::string::~string((string *)&stringValue);
    }
    else {
      bVar3 = false;
    }
  }
  else {
    dest->num = 0;
    stringValue._M_dataplus._M_p = (pointer)&stringValue.field_2;
    stringValue.field_2._M_allocated_capacity = 0;
    stringValue.field_2._8_8_ = 0;
    stringValue._M_string_length = 0;
    std::__cxx11::string::operator=((string *)&dest->name,(string *)&stringValue);
    std::__cxx11::string::~string((string *)&stringValue);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool MipsParser::parseRspVectorElement(Parser& parser, MipsRegisterValue& dest)
{
	dest.type = MipsRegisterType::RspVectorElement;

	if (parser.peekToken().type == TokenType::LBrack)
	{
		static const MipsRegisterDescriptor rspElementNames[] = {
			{ "0q", 2 },  { "1q", 3 }, { "0h", 4 },  { "1h", 5 },
			{ "2h", 6 },  { "3h", 7 }, { "0w", 8 },  { "0", 8 },
			{ "1w", 9 },  { "1", 9 },  { "2w", 10 }, { "2", 10 },
			{ "3w", 11 }, { "3", 11 }, { "4w", 12 }, { "4", 12 },
			{ "5w", 13 }, { "5", 13 }, { "6w", 14 }, { "6", 14 },
			{ "7w", 15 }, { "7", 15 },
		};

		parser.eatToken();

		if (parseRegisterNumber(parser, dest, 16))
			return parser.nextToken().type == TokenType::RBrack;

		const Token& token = parser.nextToken();

		if (token.type != TokenType::Integer && token.type != TokenType::NumberString)
			return false;

		//ignore the numerical values, just use the original text as an identifier
		std::string stringValue = token.getOriginalText();
		if (std::any_of(stringValue.begin(), stringValue.end(), iswupper))
		{
			std::transform(stringValue.begin(), stringValue.end(), stringValue.begin(), tolower);
		}

		for (size_t i = 0; i < std::size(rspElementNames); i++)
		{
			if (stringValue == rspElementNames[i].name)
			{
				dest.num = rspElementNames[i].num;
				dest.name = Identifier(rspElementNames[i].name);

				return parser.nextToken().type == TokenType::RBrack;
			}
		}

		return false;
	}

	dest.num = 0;
	dest.name = Identifier();

	return true;

}